

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::clear(UnlockedPoolAllocator *this)

{
  bool bVar1;
  pointer ppVar2;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *in_RDI
  ;
  void *ptr;
  iterator it;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18 [2];
  void *local_8;
  
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1aca2b);
    local_8 = ppVar2->second;
    if (local_8 != (void *)0x0) {
      free(local_8);
    }
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(local_18);
  }
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::clear
            (in_RDI);
  return;
}

Assistant:

void UnlockedPoolAllocator::clear()
{
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        void* ptr = it->second;
        ncnn::fastFree(ptr);
    }
    d->budgets.clear();
}